

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O0

int Abc_NtkAigToBdd(Abc_Ntk_t *pNtk)

{
  Vec_Int_t *pVVar1;
  DdManager *ddDestination;
  DdManager *f;
  int iVar2;
  uint numVars;
  int iVar3;
  DdNode *pDVar4;
  Hop_Obj_t *pHVar5;
  int *Permute;
  Hop_Obj_t **p;
  int local_58;
  int local_54;
  int iVar;
  int k;
  int i;
  int nFaninsMax;
  Vec_Int_t *vFanins;
  DdManager *ddTemp;
  DdManager *dd;
  DdNode *pFunc;
  Hop_Man_t *pMan;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  vFanins = (Vec_Int_t *)0x0;
  _i = (Vec_Int_t *)0x0;
  pNode = (Abc_Obj_t *)pNtk;
  iVar2 = Abc_NtkHasAig(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkHasAig(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x28a,"int Abc_NtkAigToBdd(Abc_Ntk_t *)");
  }
  numVars = Abc_NtkGetFaninMax((Abc_Ntk_t *)pNode);
  if (numVars == 0) {
    printf("Warning: The network has only constant nodes.\n");
  }
  ddTemp = Cudd_Init(numVars,0,0x100,0x40000,0);
  vFanins = (Vec_Int_t *)Cudd_Init(numVars,0,0x100,0x40000,0);
  Cudd_AutodynEnable((DdManager *)vFanins,CUDD_REORDER_SYMM_SIFT);
  _i = Vec_IntAlloc(numVars);
  pFunc = *(DdNode **)&pNode[3].vFanouts;
  iVar2 = Hop_ManPiNum((Hop_Man_t *)pFunc);
  if (iVar2 < (int)numVars) {
    __assert_fail("Hop_ManPiNum(pMan) >= nFaninsMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x29a,"int Abc_NtkAigToBdd(Abc_Ntk_t *)");
  }
  for (iVar = 0; iVar < (int)numVars; iVar = iVar + 1) {
    pDVar4 = Cudd_bddIthVar((DdManager *)vFanins,iVar);
    pHVar5 = Hop_ManPi((Hop_Man_t *)pFunc,iVar);
    (pHVar5->field_0).pData = pDVar4;
  }
  iVar = 0;
  do {
    iVar2 = Vec_PtrSize((Vec_Ptr_t *)(pNode->vFanins).pArray);
    if (iVar2 <= iVar) {
      Extra_StopManager((DdManager *)vFanins);
      Vec_IntFreeP((Vec_Int_t **)&i);
      Hop_ManStop(*(Hop_Man_t **)&pNode[3].vFanouts);
      *(DdManager **)&pNode[3].vFanouts = ddTemp;
      *(undefined4 *)((long)&pNode->pNtk + 4) = 2;
      return 1;
    }
    pMan = (Hop_Man_t *)Abc_NtkObj((Abc_Ntk_t *)pNode,iVar);
    if (((pMan != (Hop_Man_t *)0x0) && (iVar2 = Abc_ObjIsNode((Abc_Obj_t *)pMan), iVar2 != 0)) &&
       (iVar2 = Abc_ObjIsBarBuf((Abc_Obj_t *)pMan), iVar2 == 0)) {
      dd = (DdManager *)Abc_ConvertAigToBdd((DdManager *)vFanins,(pMan->Ghost).pFanin1);
      if (dd == (DdManager *)0x0) {
        printf("Abc_NtkAigToBdd: Error while converting AIG into BDD.\n");
        return 0;
      }
      Cudd_Ref((DdNode *)dd);
      pVVar1 = _i;
      iVar2 = Abc_ObjFaninNum((Abc_Obj_t *)pMan);
      Vec_IntFill(pVVar1,iVar2,-1);
      local_58 = 0;
      for (local_54 = 0; local_54 < (int)numVars; local_54 = local_54 + 1) {
        iVar2 = vFanins[0x14].pArray[local_54];
        iVar3 = Abc_ObjFaninNum((Abc_Obj_t *)pMan);
        if (iVar2 < iVar3) {
          Vec_IntWriteEntry(_i,vFanins[0x14].pArray[local_54],local_58);
          local_58 = local_58 + 1;
        }
      }
      iVar2 = Abc_ObjFaninNum((Abc_Obj_t *)pMan);
      f = dd;
      ddDestination = ddTemp;
      pVVar1 = vFanins;
      if (local_58 != iVar2) {
        __assert_fail("iVar == Abc_ObjFaninNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                      ,0x2af,"int Abc_NtkAigToBdd(Abc_Ntk_t *)");
      }
      Permute = Vec_IntArray(_i);
      pHVar5 = (Hop_Obj_t *)
               Extra_TransferPermute((DdManager *)pVVar1,ddDestination,&f->sentinel,Permute);
      (pMan->Ghost).pFanin1 = pHVar5;
      Cudd_Ref((DdNode *)(pMan->Ghost).pFanin1);
      Cudd_RecursiveDeref((DdManager *)vFanins,&dd->sentinel);
      Vec_IntClear(_i);
      for (local_54 = 0; local_54 < (int)numVars; local_54 = local_54 + 1) {
        iVar2 = vFanins[0x14].pArray[local_54];
        iVar3 = Abc_ObjFaninNum((Abc_Obj_t *)pMan);
        pVVar1 = _i;
        if (iVar2 < iVar3) {
          iVar2 = Vec_IntEntry((Vec_Int_t *)&pMan->pConst1,vFanins[0x14].pArray[local_54]);
          Vec_IntPush(pVVar1,iVar2);
        }
      }
      for (local_54 = 0; iVar2 = Abc_ObjFaninNum((Abc_Obj_t *)pMan), local_54 < iVar2;
          local_54 = local_54 + 1) {
        p = &pMan->pConst1;
        iVar2 = Vec_IntEntry(_i,local_54);
        Vec_IntWriteEntry((Vec_Int_t *)p,local_54,iVar2);
      }
    }
    iVar = iVar + 1;
  } while( true );
}

Assistant:

int Abc_NtkAigToBdd( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    Hop_Man_t * pMan;
    DdNode * pFunc;
    DdManager * dd, * ddTemp = NULL;
    Vec_Int_t * vFanins = NULL;
    int nFaninsMax, i, k, iVar;

    assert( Abc_NtkHasAig(pNtk) ); 

    // start the functionality manager
    nFaninsMax = Abc_NtkGetFaninMax( pNtk );
    if ( nFaninsMax == 0 )
        printf( "Warning: The network has only constant nodes.\n" );

    dd = Cudd_Init( nFaninsMax, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );

    // start temporary manager for reordered local functions
    ddTemp = Cudd_Init( nFaninsMax, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( ddTemp,  CUDD_REORDER_SYMM_SIFT );
    vFanins = Vec_IntAlloc( nFaninsMax );

    // set the mapping of elementary AIG nodes into the elementary BDD nodes
    pMan = (Hop_Man_t *)pNtk->pManFunc;
    assert( Hop_ManPiNum(pMan) >= nFaninsMax ); 
    for ( i = 0; i < nFaninsMax; i++ )
        Hop_ManPi(pMan, i)->pData = Cudd_bddIthVar(ddTemp, i);

    // convert each node from SOP to BDD
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjIsBarBuf(pNode) )
            continue;
        pFunc = Abc_ConvertAigToBdd( ddTemp, (Hop_Obj_t *)pNode->pData );
        if ( pFunc == NULL )
        {
            printf( "Abc_NtkAigToBdd: Error while converting AIG into BDD.\n" );
            return 0;
        }
        Cudd_Ref( pFunc );
        // find variable mapping
        Vec_IntFill( vFanins, Abc_ObjFaninNum(pNode), -1 );
        for ( k = iVar = 0; k < nFaninsMax; k++ )
            if ( ddTemp->invperm[k] < Abc_ObjFaninNum(pNode) )
                Vec_IntWriteEntry( vFanins, ddTemp->invperm[k], iVar++ );
        assert( iVar == Abc_ObjFaninNum(pNode) );
        // transfer to the main manager
        pNode->pData = Extra_TransferPermute( ddTemp, dd, pFunc, Vec_IntArray(vFanins) );
        Cudd_Ref( (DdNode *)pNode->pData );
        Cudd_RecursiveDeref( ddTemp, pFunc );
        // update variable order
        Vec_IntClear( vFanins );
        for ( k = 0; k < nFaninsMax; k++ )
            if ( ddTemp->invperm[k] < Abc_ObjFaninNum(pNode) )
                Vec_IntPush( vFanins, Vec_IntEntry(&pNode->vFanins, ddTemp->invperm[k]) );
        for ( k = 0; k < Abc_ObjFaninNum(pNode); k++ )
            Vec_IntWriteEntry( &pNode->vFanins, k, Vec_IntEntry(vFanins, k) );
    }

//    printf( "Reorderings performed = %d.\n", Cudd_ReadReorderings(ddTemp) );
    Extra_StopManager( ddTemp );
    Vec_IntFreeP( &vFanins );
    Hop_ManStop( (Hop_Man_t *)pNtk->pManFunc );
    pNtk->pManFunc = dd;

    // update the network type
    pNtk->ntkFunc = ABC_FUNC_BDD;
    return 1;
}